

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IOperatorReader.cpp
# Opt level: O3

void __thiscall IOperatorReader::getWord(IOperatorReader *this,string *str)

{
  pointer pcVar1;
  char cVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  char cVar6;
  ulong uVar7;
  string tempStr;
  string local_f0;
  string local_d0;
  undefined1 *local_b0;
  undefined8 local_a8;
  undefined1 local_a0 [16];
  string local_90;
  string local_70;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  local_b0 = local_a0;
  local_a8 = 0;
  local_a0[0] = 0;
  bVar4 = true;
  while (cVar2 = std::istream::get(), cVar2 != -1) {
    bVar3 = IDictionary::isOperator(cVar2);
    cVar6 = (char)str;
    if (bVar3) {
      bVar4 = false;
      std::__cxx11::string::push_back(cVar6);
    }
    else {
      if ((!bVar4) || (bVar4 = IDictionary::isBracket1l(cVar2), !bVar4)) break;
      std::__cxx11::string::push_back(cVar6);
      while ((cVar2 = std::istream::get(), cVar2 != -1 &&
             (bVar4 = IDictionary::isBlankSep(cVar2), bVar4))) {
        std::__cxx11::string::push_back(cVar6);
        if (cVar2 == '\n') {
          std::__cxx11::string::push_back(cVar6);
        }
      }
      do {
        bVar4 = IDictionary::isLetterOrNumberOrDL(cVar2);
        if (!bVar4) break;
        std::__cxx11::string::push_back(cVar6);
        cVar2 = std::istream::get();
      } while (cVar2 != -1);
      std::__cxx11::string::substr((ulong)&local_70,(ulong)str);
      bVar4 = IDictionary::isBaseType(&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      if (bVar4) {
        do {
          bVar4 = IDictionary::isBlankSep(cVar2);
          if (!bVar4) break;
          std::__cxx11::string::push_back(cVar6);
          if (cVar2 == '\n') {
            std::__cxx11::string::push_back(cVar6);
          }
          cVar2 = std::istream::get();
        } while (cVar2 != -1);
        bVar4 = IDictionary::isBracket1r(cVar2);
        if (bVar4) {
          std::__cxx11::string::push_back(cVar6);
          *(byte *)&this->m_type = (byte)this->m_type | 2;
          break;
        }
      }
      bVar4 = false;
      std::__cxx11::string::_M_replace((ulong)str,0,(char *)str->_M_string_length,0x10c0b4);
    }
  }
  std::__cxx11::string::_M_assign((string *)&local_b0);
  if (0 < (int)(uint)local_a8) {
    uVar7 = (ulong)((uint)local_a8 & 0x7fffffff);
    while( true ) {
      std::__cxx11::string::substr((ulong)local_50,(ulong)&local_b0);
      std::__cxx11::string::operator=((string *)str,(string *)local_50);
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      pcVar1 = (str->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_d0,pcVar1,pcVar1 + str->_M_string_length);
      bVar4 = IDictionary::isOperator0(&local_d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p);
      }
      if (bVar4) {
        *(byte *)&this->m_type = (byte)this->m_type | 1;
      }
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      pcVar1 = (str->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_f0,pcVar1,pcVar1 + str->_M_string_length);
      bVar4 = IDictionary::isOperator1(&local_f0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p);
      }
      if (bVar4) {
        *(byte *)&this->m_type = (byte)this->m_type | 2;
      }
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      pcVar1 = (str->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_90,pcVar1,pcVar1 + str->_M_string_length);
      bVar4 = IDictionary::isOperator2(&local_90);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p);
      }
      if (bVar4) {
        *(byte *)&this->m_type = (byte)this->m_type | 4;
      }
      iVar5 = std::__cxx11::string::compare((char *)str);
      if (iVar5 == 0) break;
      if ((this->m_type != 0) || (bVar4 = uVar7 == 1, uVar7 = uVar7 - 1, bVar4)) goto LAB_00109b67;
    }
    this->m_type = this->m_type | 8;
  }
LAB_00109b67:
  if (local_b0 != local_a0) {
    operator_delete(local_b0);
  }
  return;
}

Assistant:

void IOperatorReader::getWord(std::string &str) {
    char tempChar;
    std::string tempStr;
    bool first_flag= true;

    while((tempChar = this->m_ifs->get()) != EOF)
    {
        if(IDictionary::isOperator(tempChar))
        {
            str += tempChar;
        }
        else if(first_flag&&IDictionary::isBracket1l(tempChar))
        {
            str += tempChar;
            while((tempChar = this->m_ifs->get()) != EOF)
            {
                if(IDictionary::isBlankSep(tempChar))
                {
                    str+=tempChar;
                    if(tempChar=='\n')
                        str+='\n';
                }
                else
                    break;
            }
            do
            {
                if(IDictionary::isLetterOrNumberOrDL(tempChar))
                {
                    str+=tempChar;
                }
                else
                {
                    break;
                }
            }while((tempChar = this->m_ifs->get()) != EOF);
            if(!IDictionary::isBaseType(str.substr(1,str.length()-1)))
            {
                str="";
            }
            else
            {
                do
                {
                    if(IDictionary::isBlankSep(tempChar))
                    {
                        str+=tempChar;
                        if(tempChar=='\n')
                            str+='\n';
                    }
                    else
                        break;
                }while((tempChar = this->m_ifs->get()) != EOF);
                if(IDictionary::isBracket1r(tempChar))
                {
                    str += tempChar;
                    m_type|=2;
                    break;
                }
                else
                    str="";
            }
        }
        else
        {
            break;
        }
        first_flag= false;
    }

    tempStr=str;
    int maxLen=tempStr.length();

    for(int i=0;i<maxLen;i++)
    {
        str=tempStr.substr(0,maxLen-i);
        if(IDictionary::isOperator0(str))
        {
            m_type|=1;
        }
        if(IDictionary::isOperator1(str))
        {
            m_type|=2;
        }
        if(IDictionary::isOperator2(str))
        {
            m_type|=4;
        }
        if(str==",")
        {
            m_type|=8;
        }
        if(m_type)
            break;
    }
}